

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int calc_bank_base(void)

{
  int iVar1;
  
  iVar1 = 0x80;
  if (cd_opt == 0) {
    if (scd_opt != 0) {
      return 0x68;
    }
    iVar1 = 0;
    if (mx_opt != 0 || develo_opt != 0) {
      iVar1 = 0x68;
      if (max_bank < 4) {
        iVar1 = 0x84;
      }
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int
calc_bank_base(void)
{
	int base;

	/* cd */
	if (cd_opt)
		base = 0x80;

	/* super cd */
	else if (scd_opt)
		base = 0x68;

	/* develo */
	else if (develo_opt || mx_opt) {
		if (max_bank < 4)
			base = 0x84;
		else
			base = 0x68;
	}

	/* default */
	else {
		base = 0;
	}

	return (base);
}